

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<8>
embree::avx::BVHBuilderBinnedFastSpatialSAH::
build<embree::NodeRefPtr<8>,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>,embree::avx::TriangleSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
          (undefined8 createAlloc,undefined8 *param_2,Scene *param_3,undefined8 param_4,
          PrimRef *param_5,undefined8 param_6,PrimInfo *param_7,undefined8 param_8)

{
  size_t sVar1;
  size_t sVar2;
  char cVar3;
  NodeRefPtr<8> NVar4;
  runtime_error *prVar5;
  plus<double> local_161;
  float invA;
  undefined4 uStack_15c;
  PrimRef *prims_local;
  undefined8 local_150;
  undefined8 *local_148;
  char local_140 [8];
  undefined8 local_138;
  double local_130;
  float f;
  undefined4 uStack_124;
  anon_class_32_4_238fc3ac local_120;
  Heuristic heuristic;
  TriangleSplitterFactory splitPrimitive_local;
  anon_class_16_2_ed117de8_conflict4 local_e0;
  anon_class_24_3_8ee612a4_conflict local_d0;
  task_group_context context;
  
  heuristic.splitterFactory = &splitPrimitive_local;
  _invA = &prims_local;
  heuristic.root_info = &param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>;
  sVar1 = param_7->end;
  sVar2 = param_7->begin;
  _f = 0.0;
  local_d0.func = (anon_class_8_1_a879a1ad *)&invA;
  prims_local = param_5;
  local_150 = createAlloc;
  local_148 = param_2;
  local_140 = (char  [8])param_6;
  local_138 = param_4;
  heuristic.prims0 = param_5;
  splitPrimitive_local.scene = param_3;
  local_d0.identity = (double *)&f;
  local_d0.reduction = &local_161;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_120.f = (float *)0x0;
  local_120.pinfo = (PrimInfo *)0x1;
  local_120.prims = (PrimRef **)(sVar1 - sVar2);
  local_e0.reduction = &local_161;
  local_e0.func = &local_d0;
  local_130 = tbb::detail::d1::
              parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<double>_>
                        ((blocked_range<unsigned_long> *)&local_120,(double *)&f,&local_e0,
                         &local_161,&context);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar3 != '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"task cancelled");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  _f = (double)CONCAT44(uStack_124,0x41200000);
  _invA = (PrimRef **)CONCAT44(uStack_15c,1.0 / (float)local_130);
  sVar1 = param_7->end;
  sVar2 = param_7->begin;
  local_120.prims = &prims_local;
  local_120.pinfo = param_7;
  local_120.invA = &invA;
  local_120.f = &f;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_d0.reduction = (plus<double> *)0x0;
  local_d0.func = (anon_class_8_1_a879a1ad *)0x1;
  local_e0.reduction = (plus<double> *)&local_120;
  local_d0.identity = (double *)(sVar1 - sVar2);
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:70:73)>
            ((blocked_range<unsigned_long> *)&local_d0,(anon_class_8_1_898bcfc2 *)&local_e0,&context
            );
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar3 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    context.padding._0_8_ = param_7->end - param_7->begin;
    context.my_cpu_ctl_env =
         *(uint64_t *)
          &(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
    context._8_8_ =
         *(undefined8 *)
          ((long)&(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
          + 8);
    context.field_6 =
         *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
          &(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0;
    context.my_context_list =
         *(context_list **)
          ((long)&(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
          + 8);
    context.my_node.my_prev_node =
         *(intrusive_list_node **)
          &(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0;
    context.my_node.my_next_node =
         *(intrusive_list_node **)
          ((long)&(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
          + 8);
    context.my_exception._M_b._M_p =
         *(__base_type *)
          &(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0;
    context.my_itt_caller =
         *(void **)((long)&(param_7->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper
                           .field_0 + 8);
    context.my_name = ALGORITHM;
    context.padding[8] = local_140[0];
    context.padding[9] = local_140[1];
    context.padding[10] = local_140[2];
    context.padding[0xb] = local_140[3];
    context.padding[0xc] = local_140[4];
    context.padding[0xd] = local_140[5];
    context.padding[0xe] = local_140[6];
    context.padding[0xf] = local_140[7];
    local_120.prims = (PrimRef **)*local_148;
    NVar4 = GeneralBVHBuilder::
            build<embree::NodeRefPtr<8>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>,embree::Scene::BuildProgressMonitorInterface>
                      (&heuristic,prims_local,&context,local_150,&local_120,local_138,param_8);
    return (NodeRefPtr<8>)NVar4.ptr;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"task cancelled");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ReductionTy build(CreateAllocFunc createAlloc,
                                 CreateNodeFunc createNode,
                                 UpdateNodeFunc updateNode,
                                 const CreateLeafFunc& createLeaf,
                                 SplitPrimitiveFunc splitPrimitive,
                                 ProgressMonitor progressMonitor,
                                 PrimRef* prims,
                                 const size_t extSize,
                                 const PrimInfo& pinfo,
                                 const Settings& settings)
        {
          typedef HeuristicArraySpatialSAH<SplitPrimitiveFunc,PrimRef,NUM_OBJECT_BINS,NUM_SPATIAL_BINS> Heuristic;
          Heuristic heuristic(splitPrimitive,prims,pinfo);

          /* calculate total surface area */ // FIXME: this sum is not deterministic
          const float A = (float) parallel_reduce(size_t(0),pinfo.size(),0.0, [&] (const range<size_t>& r) -> double {

              double A = 0.0f;
              for (size_t i=r.begin(); i<r.end(); i++)
              {
                PrimRef& prim = prims[i];
                A += area(prim.bounds());
              }
              return A;
            },std::plus<double>());


          /* calculate maximum number of spatial splits per primitive */
          const unsigned int maxSplits = ((size_t)1 << RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)-1;
          const float f = 10.0f;

          const float invA = 1.0f / A;
          parallel_for( size_t(0), pinfo.size(), [&](const range<size_t>& r) {

              for (size_t i=r.begin(); i<r.end(); i++)
              {
                PrimRef& prim = prims[i];
                assert((prim.geomID() & SPLITS_MASK) == 0);
                // FIXME: is there a better general heuristic ?
                const float nf = ceilf(f*pinfo.size()*area(prim.bounds()) * invA);
                unsigned int n = 4+min((int)maxSplits-4, max(1, (int)(nf)));
                prim.lower.u |= n << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS);
              }
            });

          return GeneralBVHBuilder::build<ReductionTy,Heuristic,Set,PrimRef>(
            heuristic,
            prims,
            PrimInfoExtRange(0,pinfo.size(),extSize,pinfo),
            createAlloc,
            createNode,
            updateNode,
            CreateLeafExt<ReductionTy,CreateLeafFunc>(createLeaf),
            progressMonitor,
            settings);
        }